

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.cpp
# Opt level: O2

Offset<MyGame::Example::Monster> populate1(FlatBufferBuilder *builder)

{
  Offset<flatbuffers::String> name;
  Offset<MyGame::Example::Monster> OVar1;
  string local_38;
  
  m1_name_abi_cxx11_();
  name = flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                   (builder,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  OVar1 = MyGame::Example::CreateMonster
                    (builder,(Vec3 *)0x0,0,0,name,
                     (Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0,Color_Red,
                     Any_MIN,(Offset<void>)0x0,
                     (Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_>)0x0,
                     (Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
                      )0x0,(Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>
                            )0x0,(Offset<MyGame::Example::Monster>)0x0,
                     (Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0,
                     (Offset<MyGame::Example::Stat>)0x0,false,0,0,0,0,0,0,0,0,
                     (Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0,3.14159,3.0,0.0,
                     (Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
                      )0x0,(Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_>
                            )0x0,(Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0,
                     (Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_>)0x0,
                     (Offset<flatbuffers::Vector<long,_unsigned_int>_>)0x0,
                     (Offset<flatbuffers::Vector<double,_unsigned_int>_>)0x0,
                     (Offset<MyGame::InParentNamespace>)0x0,
                     (Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
                      )0x0,0,(Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_>)0x0,
                     (Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
                      )0x0,0,(Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_>)0x0,0,
                     (Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_>)0x0,
                     AnyUniqueAliases_MIN,(Offset<void>)0x0,AnyAmbiguousAliases_MIN,
                     (Offset<void>)0x0,
                     (Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0,Race_MIN,
                     (Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0,
                     (Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_>
                      )0x0,(Test *)0x0,LongEnum_NONE,LongEnum_LongOne,NAN,INFINITY,INFINITY,INFINITY
                     ,INFINITY,-INFINITY,-INFINITY,INFINITY);
  return (Offset<MyGame::Example::Monster>)OVar1.o;
}

Assistant:

flatbuffers::Offset<Monster> populate1(
    flatbuffers::FlatBufferBuilder &builder) {
  auto name_offset = builder.CreateString(m1_name());
  return CreateMonster(builder, nullptr, 0, 0, name_offset, 0, m1_color());
}